

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall
SQVM::StartCall(SQVM *this,SQClosure *closure,SQInteger target,SQInteger args,SQInteger stackbase,
               bool tailcall)

{
  long lVar1;
  SQFunctionProto *pSVar2;
  long lVar3;
  SQObjectPtr *pSVar4;
  CallInfo *pCVar5;
  bool bVar6;
  SQArray *x;
  SQGenerator *this_00;
  SQInteger n;
  long lVar7;
  long lVar8;
  long lVar9;
  SQObjectPtr temp;
  
  pSVar2 = closure->_function;
  lVar8 = pSVar2->_nparameters;
  lVar3 = pSVar2->_stacksize;
  if (pSVar2->_varparams == 0) {
    if (lVar8 != args) {
      lVar1 = pSVar2->_ndefaultparams;
      lVar9 = lVar8 - args;
      if (((lVar9 == 0 || lVar8 < args) || lVar1 == 0) || (lVar8 = lVar1 - lVar9, lVar1 < lVar9))
      goto LAB_00158a47;
      lVar7 = lVar8 * 0x10;
      lVar9 = args * 0x10 + stackbase * 0x10;
      for (; lVar8 < lVar1; lVar8 = lVar8 + 1) {
        SQObjectPtr::operator=
                  ((SQObjectPtr *)((long)&(((this->_stack)._vals)->super_SQObject)._type + lVar9),
                   (SQObjectPtr *)((long)&(closure->_defaultparams->super_SQObject)._type + lVar7));
        lVar7 = lVar7 + 0x10;
        lVar9 = lVar9 + 0x10;
      }
    }
  }
  else {
    lVar1 = lVar8 + -1;
    lVar9 = args - lVar1;
    if (args < lVar1) {
LAB_00158a47:
      Raise_Error(this,"wrong number of parameters");
      return false;
    }
    x = SQArray::Create(this->_sharedstate,lVar9);
    lVar7 = 0;
    if (lVar9 < 1) {
      lVar9 = lVar7;
    }
    while( true ) {
      pSVar4 = (this->_stack)._vals;
      if (lVar9 == 0) break;
      SQObjectPtr::operator=
                ((SQObjectPtr *)((long)&(((x->_values)._vals)->super_SQObject)._type + lVar7),
                 (SQObjectPtr *)((long)&pSVar4[stackbase + lVar8 + -1].super_SQObject._type + lVar7)
                );
      SQObjectPtr::Null((SQObjectPtr *)
                        ((long)&(this->_stack)._vals[stackbase + lVar8 + -1].super_SQObject._type +
                        lVar7));
      lVar7 = lVar7 + 0x10;
      lVar9 = lVar9 + -1;
    }
    SQObjectPtr::operator=(pSVar4 + lVar1 + stackbase,x);
  }
  if (closure->_env != (SQWeakRef *)0x0) {
    SQObjectPtr::operator=((this->_stack)._vals + stackbase,&closure->_env->_obj);
  }
  bVar6 = EnterFrame(this,stackbase,lVar3 + stackbase,tailcall);
  if (bVar6) {
    SQObjectPtr::operator=(&this->ci->_closure,closure);
    pCVar5 = this->ci;
    pCVar5->_literals = pSVar2->_literals;
    pCVar5->_ip = pSVar2->_instructions;
    pCVar5->_target = (SQInt32)target;
    if (this->_debughook == true) {
      CallDebugHook(this,99,0);
    }
    pSVar2 = closure->_function;
    if (pSVar2->_bgenerator != true) {
      return true;
    }
    this_00 = SQGenerator::Create(this->_sharedstate,closure);
    bVar6 = SQGenerator::Yield(this_00,this,pSVar2->_stacksize);
    if (bVar6) {
      temp.super_SQObject._type = OT_NULL;
      temp.super_SQObject._unVal.pTable = (SQTable *)0x0;
      Return(this,1,target,&temp);
      SQObjectPtr::operator=((this->_stack)._vals + this->_stackbase + target,this_00);
      SQObjectPtr::~SQObjectPtr(&temp);
      return true;
    }
  }
  return false;
}

Assistant:

bool SQVM::StartCall(SQClosure *closure,SQInteger target,SQInteger args,SQInteger stackbase,bool tailcall)
{
    SQFunctionProto *func = closure->_function;

    SQInteger paramssize = func->_nparameters;
    const SQInteger newtop = stackbase + func->_stacksize;
    SQInteger nargs = args;
    if(func->_varparams)
    {
        paramssize--;
        if (nargs < paramssize) {
            Raise_Error(_SC("wrong number of parameters"));
            return false;
        }

        //dumpstack(stackbase);
        SQInteger nvargs = nargs - paramssize;
        SQArray *arr = SQArray::Create(_ss(this),nvargs);
        SQInteger pbase = stackbase+paramssize;
        for(SQInteger n = 0; n < nvargs; n++) {
            arr->_values[n] = _stack._vals[pbase];
            _stack._vals[pbase].Null();
            pbase++;

        }
        _stack._vals[stackbase+paramssize] = arr;
        //dumpstack(stackbase);
    }
    else if (paramssize != nargs) {
        SQInteger ndef = func->_ndefaultparams;
        SQInteger diff;
        if(ndef && nargs < paramssize && (diff = paramssize - nargs) <= ndef) {
            for(SQInteger n = ndef - diff; n < ndef; n++) {
                _stack._vals[stackbase + (nargs++)] = closure->_defaultparams[n];
            }
        }
        else {
            Raise_Error(_SC("wrong number of parameters"));
            return false;
        }
    }

    if(closure->_env) {
        _stack._vals[stackbase] = closure->_env->_obj;
    }

    if(!EnterFrame(stackbase, newtop, tailcall)) return false;

    ci->_closure  = closure;
    ci->_literals = func->_literals;
    ci->_ip       = func->_instructions;
    ci->_target   = (SQInt32)target;

    if (_debughook) {
        CallDebugHook(_SC('c'));
    }

    if (closure->_function->_bgenerator) {
        SQFunctionProto *f = closure->_function;
        SQGenerator *gen = SQGenerator::Create(_ss(this), closure);
        if(!gen->Yield(this,f->_stacksize))
            return false;
        SQObjectPtr temp;
        Return(1, target, temp);
        STK(target) = gen;
    }


    return true;
}